

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

void Gia_ObjSimCollect(Gia_SimRsbMan_t *p)

{
  Gia_Man_t *pGVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pObj;
  int iFanout;
  int iTemp;
  int k;
  int i;
  Gia_SimRsbMan_t *p_local;
  
  Vec_IntClear(p->vFanins2);
  iVar3 = Vec_IntSize(p->vFanins);
  if (iVar3 < 1) {
    __assert_fail("Vec_IntSize(p->vFanins) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x22a,"void Gia_ObjSimCollect(Gia_SimRsbMan_t *)");
  }
  for (iTemp = 0; iVar3 = Vec_IntSize(p->vFanins), iTemp < iVar3; iTemp = iTemp + 1) {
    iVar3 = Vec_IntEntry(p->vFanins,iTemp);
    pGVar6 = Gia_ManObj(p->pGia,iVar3);
    iVar4 = Gia_ObjIsAnd(pGVar6);
    if (iVar4 != 0) {
      pGVar1 = p->pGia;
      iVar4 = Gia_ObjFaninId0(pGVar6,iVar3);
      iVar4 = Gia_ObjIsTravIdCurrentId(pGVar1,iVar4);
      if (iVar4 == 0) {
        pVVar2 = p->vFanins2;
        iVar4 = Gia_ObjFaninId0(pGVar6,iVar3);
        Vec_IntPush(pVVar2,iVar4);
      }
    }
    iVar4 = Gia_ObjIsAnd(pGVar6);
    if (iVar4 != 0) {
      pGVar1 = p->pGia;
      iVar4 = Gia_ObjFaninId1(pGVar6,iVar3);
      iVar4 = Gia_ObjIsTravIdCurrentId(pGVar1,iVar4);
      if (iVar4 == 0) {
        pVVar2 = p->vFanins2;
        iVar4 = Gia_ObjFaninId1(pGVar6,iVar3);
        Vec_IntPush(pVVar2,iVar4);
      }
    }
    for (iFanout = 0; iVar4 = Gia_ObjFanoutNumId(p->pGia,iVar3), iFanout < iVar4;
        iFanout = iFanout + 1) {
      iVar4 = Gia_ObjFanoutId(p->pGia,iVar3,iFanout);
      pGVar6 = Gia_ManObj(p->pGia,iVar4);
      iVar5 = Gia_ObjIsAnd(pGVar6);
      if ((iVar5 != 0) && (iVar5 = Gia_ObjIsTravIdCurrentId(p->pGia,iVar4), iVar5 == 0)) {
        Vec_IntPush(p->vFanins2,iVar4);
      }
    }
  }
  return;
}

Assistant:

void Gia_ObjSimCollect( Gia_SimRsbMan_t * p )
{
    int i, k, iTemp, iFanout;
    Vec_IntClear( p->vFanins2 );
    assert( Vec_IntSize(p->vFanins) > 0 );
    Vec_IntForEachEntry( p->vFanins, iTemp, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p->pGia, iTemp );
        if ( Gia_ObjIsAnd(pObj) && !Gia_ObjIsTravIdCurrentId( p->pGia, Gia_ObjFaninId0(pObj, iTemp) ) )
            Vec_IntPush( p->vFanins2, Gia_ObjFaninId0(pObj, iTemp) );
        if ( Gia_ObjIsAnd(pObj) && !Gia_ObjIsTravIdCurrentId( p->pGia, Gia_ObjFaninId1(pObj, iTemp) ) )
            Vec_IntPush( p->vFanins2, Gia_ObjFaninId1(pObj, iTemp) );
        Gia_ObjForEachFanoutStaticId( p->pGia, iTemp, iFanout, k )
            if ( Gia_ObjIsAnd(Gia_ManObj(p->pGia, iFanout)) && !Gia_ObjIsTravIdCurrentId( p->pGia, iFanout ) )
                Vec_IntPush( p->vFanins2, iFanout );
    }
}